

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats,bool _printInfoMessages)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  bool _printInfoMessages_local;
  AssertionStats *_stats_local;
  ostream *_stream_local;
  AssertionPrinter *this_local;
  
  this->stream = _stream;
  this->stats = _stats;
  this->result = &_stats->assertionResult;
  this->colour = None;
  std::__cxx11::string::string((string *)&this->passOrFail);
  std::__cxx11::string::string((string *)&this->messageLabel);
  AssertionResult::getMessage_abi_cxx11_(&this->message,this->result);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->messages,&_stats->infoMessages);
  this->printInfoMessages = _printInfoMessages;
  OVar2 = AssertionResult::getResultType(this->result);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      this->colour = Green;
      std::__cxx11::string::operator=((string *)&this->passOrFail,"PASSED");
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (&_stats->infoMessages);
      if (sVar3 == 1) {
        std::__cxx11::string::operator=((string *)&this->messageLabel,"with message");
      }
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        (&_stats->infoMessages);
      if (sVar3 < 2) {
        return;
      }
      std::__cxx11::string::operator=((string *)&this->messageLabel,"with messages");
      return;
    }
    if (OVar2 == Info) {
      std::__cxx11::string::operator=((string *)&this->messageLabel,"info");
      return;
    }
    if (OVar2 == Warning) {
      std::__cxx11::string::operator=((string *)&this->messageLabel,"warning");
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          this->colour = Green;
          std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED - but was ok");
        }
        else {
          this->colour = BrightRed;
          std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (&_stats->infoMessages);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=((string *)&this->messageLabel,"with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (&_stats->infoMessages);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=((string *)&this->messageLabel,"with messages");
        return;
      }
      if (OVar2 == ExplicitFailure) {
        std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED");
        this->colour = BrightRed;
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (&_stats->infoMessages);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=((string *)&this->messageLabel,"explicitly with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (&_stats->infoMessages);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=((string *)&this->messageLabel,"explicitly with messages");
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          this->colour = BrightRed;
          std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED");
          std::__cxx11::string::operator=
                    ((string *)&this->messageLabel,"due to unexpected exception with message");
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          this->colour = BrightRed;
          std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED");
          std::__cxx11::string::operator=
                    ((string *)&this->messageLabel,"due to a fatal error condition");
          return;
        }
        this->colour = BrightRed;
        std::__cxx11::string::operator=((string *)&this->passOrFail,"FAILED");
        std::__cxx11::string::operator=
                  ((string *)&this->messageLabel,
                   "because no exception was thrown where one was expected");
        return;
      }
    }
  }
  std::__cxx11::string::operator=((string *)&this->passOrFail,"** internal error **");
  this->colour = BrightRed;
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats, bool _printInfoMessages )
            :   stream( _stream ),
                stats( _stats ),
                result( _stats.assertionResult ),
                colour( Colour::None ),
                message( result.getMessage() ),
                messages( _stats.infoMessages ),
                printInfoMessages( _printInfoMessages )
            {
                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        colour = Colour::Success;
                        passOrFail = "PASSED";
                        //if( result.hasMessage() )
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() ) {
                            colour = Colour::Success;
                            passOrFail = "FAILED - but was ok";
                        }
                        else {
                            colour = Colour::Error;
                            passOrFail = "FAILED";
                        }
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ThrewException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to unexpected exception with message";
                        break;
                    case ResultWas::FatalErrorCondition:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to a fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "because no exception was thrown where one was expected";
                        break;
                    case ResultWas::Info:
                        messageLabel = "info";
                        break;
                    case ResultWas::Warning:
                        messageLabel = "warning";
                        break;
                    case ResultWas::ExplicitFailure:
                        passOrFail = "FAILED";
                        colour = Colour::Error;
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "explicitly with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "explicitly with messages";
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        passOrFail = "** internal error **";
                        colour = Colour::Error;
                        break;
                }
            }